

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_test.cpp
# Opt level: O0

int main(void)

{
  element_type *peVar1;
  __shared_ptr_access<Thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  ostream *this_00;
  int local_50;
  int i_1;
  undefined1 local_40 [8];
  shared_ptr<Thread> ptThread;
  undefined1 local_28 [4];
  int i;
  vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> vec;
  
  vec.super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::vector
            ((vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> *)local_28)
  ;
  for (ptThread.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
      ptThread.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ < 100;
      ptThread.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           ptThread.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ +
           1) {
    std::make_shared<Thread,void(&)()>((_func_void *)local_40);
    peVar1 = std::__shared_ptr_access<Thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_40);
    Thread::Start(peVar1);
    std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::push_back
              ((vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> *)
               local_28,(value_type *)local_40);
    std::shared_ptr<Thread>::~shared_ptr((shared_ptr<Thread> *)local_40);
  }
  for (local_50 = 0; local_50 < 100; local_50 = local_50 + 1) {
    this = (__shared_ptr_access<Thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::
           operator[]((vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> *)
                      local_28,(long)local_50);
    peVar1 = std::__shared_ptr_access<Thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (this);
    Thread::Join(peVar1);
  }
  this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,globalVal);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::~vector
            ((vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> *)local_28)
  ;
  return vec.super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main()
{
	vector<shared_ptr<Thread>> vec;
	for (int i = 0; i < 100; ++i)
	{
		shared_ptr<Thread> ptThread = make_shared<Thread> (addGlobal);
		ptThread->Start();
		vec.push_back(ptThread);
	}
	
	for (int i = 0; i < 100; ++i)
	{
		vec[i]->Join();
	}
	
	cout << globalVal << endl;
}